

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_divl(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGTemp *ts;
  TCGTemp *ts_00;
  uint16_t uVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  code *func;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGv_i32 local_40;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = read_im16(env,s);
  if ((uVar1 >> 10 & 1) == 0) {
    pTVar2 = gen_ea(env,s,insn,2,tcg_ctx->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADU,
                    (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar2 == tcg_ctx->NULL_QREG) {
LAB_00677ddb:
      gen_addr_fault(s);
      return;
    }
    pTVar3 = tcg_const_i32_m68k(tcg_ctx,uVar1 >> 0xc & 7);
    pTVar4 = tcg_const_i32_m68k(tcg_ctx,uVar1 & 7);
    local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_50 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    local_48 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    local_40 = pTVar2 + (long)tcg_ctx;
    if ((uVar1 >> 0xb & 1) == 0) {
      func = helper_divul_m68k;
    }
    else {
      func = helper_divsl_m68k;
    }
  }
  else {
    if ((s->env->features & 0x40000) == 0) {
      gen_exception(s,(s->base).pc_next,4);
      return;
    }
    local_40 = gen_ea(env,s,insn,2,tcg_ctx->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADU,
                      (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (local_40 == tcg_ctx->NULL_QREG) goto LAB_00677ddb;
    pTVar2 = tcg_const_i32_m68k(tcg_ctx,uVar1 >> 0xc & 7);
    pTVar3 = tcg_const_i32_m68k(tcg_ctx,uVar1 & 7);
    local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_50 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    local_48 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    local_40 = local_40 + (long)tcg_ctx;
    if ((uVar1 >> 0xb & 1) == 0) {
      func = helper_divull_m68k;
    }
    else {
      func = helper_divsll_m68k;
    }
  }
  ts_00 = local_48;
  ts = local_50;
  tcg_gen_callN_m68k(tcg_ctx,func,(TCGTemp *)0x0,4,&local_58);
  tcg_temp_free_internal_m68k(tcg_ctx,ts_00);
  tcg_temp_free_internal_m68k(tcg_ctx,ts);
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

DISAS_INSN(divl)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv num, reg, den;
    int sign;
    uint16_t ext;

    ext = read_im16(env, s);

    sign = (ext & 0x0800) != 0;

    if (ext & 0x400) {
        if (!m68k_feature(s->env, M68K_FEATURE_QUAD_MULDIV)) {
            gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
            return;
        }

        /* divX.l <EA>, Dr:Dq    64/32 -> 32r:32q */

        SRC_EA(env, den, OS_LONG, 0, NULL);
        num = tcg_const_i32(tcg_ctx, REG(ext, 12));
        reg = tcg_const_i32(tcg_ctx, REG(ext, 0));
        if (sign) {
            gen_helper_divsll(tcg_ctx, tcg_ctx->cpu_env, num, reg, den);
        } else {
            gen_helper_divull(tcg_ctx, tcg_ctx->cpu_env, num, reg, den);
        }
        tcg_temp_free(tcg_ctx, reg);
        tcg_temp_free(tcg_ctx, num);
        set_cc_op(s, CC_OP_FLAGS);
        return;
    }

    /* divX.l <EA>, Dq        32/32 -> 32q     */
    /* divXl.l <EA>, Dr:Dq    32/32 -> 32r:32q */

    SRC_EA(env, den, OS_LONG, 0, NULL);
    num = tcg_const_i32(tcg_ctx, REG(ext, 12));
    reg = tcg_const_i32(tcg_ctx, REG(ext, 0));
    if (sign) {
        gen_helper_divsl(tcg_ctx, tcg_ctx->cpu_env, num, reg, den);
    } else {
        gen_helper_divul(tcg_ctx, tcg_ctx->cpu_env, num, reg, den);
    }
    tcg_temp_free(tcg_ctx, reg);
    tcg_temp_free(tcg_ctx, num);

    set_cc_op(s, CC_OP_FLAGS);
}